

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O0

void Curl_cpool_prune_dead(Curl_easy *data)

{
  _Bool _Var1;
  timediff_t tVar2;
  curltime cVar3;
  curltime older;
  undefined4 uStack_34;
  timediff_t elapsed;
  cpool_reaper_ctx rctx;
  cpool *cpool;
  Curl_easy *data_local;
  
  rctx.now._8_8_ = cpool_get_instance(data);
  if ((cpool *)rctx.now._8_8_ != (cpool *)0x0) {
    cVar3 = Curl_now();
    elapsed = cVar3.tv_sec;
    rctx.now.tv_sec._0_4_ = cVar3.tv_usec;
    rctx.now.tv_sec._4_4_ = uStack_34;
    if (rctx.now._8_8_ != 0) {
      if ((*(long *)(rctx.now._8_8_ + 0x88) != 0) &&
         ((*(uint *)(*(long *)(rctx.now._8_8_ + 0x88) + 4) & 0x20) != 0)) {
        Curl_share_lock(*(Curl_easy **)(rctx.now._8_8_ + 0x78),CURL_LOCK_DATA_CONNECT,
                        CURL_LOCK_ACCESS_SINGLE);
      }
      *(byte *)(rctx.now._8_8_ + 0x98) = *(byte *)(rctx.now._8_8_ + 0x98) & 0xfe | 1;
    }
    cVar3.tv_usec = (int)rctx.now.tv_sec;
    cVar3.tv_sec = elapsed;
    cVar3._12_4_ = 0;
    older._12_4_ = 0;
    older._0_12_ = *(undefined1 (*) [12])(rctx.now._8_8_ + 0x48);
    tVar2 = Curl_timediff(cVar3,older);
    if (999 < tVar2) {
      do {
        _Var1 = cpool_foreach(data,(cpool *)rctx.now._8_8_,&elapsed,cpool_reap_dead_cb);
      } while (_Var1);
      *(timediff_t *)(rctx.now._8_8_ + 0x48) = elapsed;
      *(ulong *)(rctx.now._8_8_ + 0x50) = CONCAT44(rctx.now.tv_sec._4_4_,(int)rctx.now.tv_sec);
    }
    if (((rctx.now._8_8_ != 0) &&
        (*(byte *)(rctx.now._8_8_ + 0x98) = *(byte *)(rctx.now._8_8_ + 0x98) & 0xfe,
        *(long *)(rctx.now._8_8_ + 0x88) != 0)) &&
       ((*(uint *)(*(long *)(rctx.now._8_8_ + 0x88) + 4) & 0x20) != 0)) {
      Curl_share_unlock(*(Curl_easy **)(rctx.now._8_8_ + 0x78),CURL_LOCK_DATA_CONNECT);
    }
  }
  return;
}

Assistant:

void Curl_cpool_prune_dead(struct Curl_easy *data)
{
  struct cpool *cpool = cpool_get_instance(data);
  struct cpool_reaper_ctx rctx;
  timediff_t elapsed;

  if(!cpool)
    return;

  rctx.now = Curl_now();
  CPOOL_LOCK(cpool);
  elapsed = Curl_timediff(rctx.now, cpool->last_cleanup);

  if(elapsed >= 1000L) {
    while(cpool_foreach(data, cpool, &rctx, cpool_reap_dead_cb))
      ;
    cpool->last_cleanup = rctx.now;
  }
  CPOOL_UNLOCK(cpool);
}